

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O3

void xmlRegisterDefaultOutputCallbacks(void)

{
  long lVar1;
  
  xmlInitParser();
  lVar1 = (long)xmlOutputCallbackNr;
  if (lVar1 < 10) {
    xmlOutputCallbackTable[lVar1].matchcallback = xmlIODefaultMatch;
    xmlOutputCallbackNr = xmlOutputCallbackNr + 1;
    xmlOutputCallbackTable[lVar1].opencallback = (xmlOutputOpenCallback)0x0;
    xmlOutputCallbackTable[lVar1].writecallback = (xmlOutputWriteCallback)0x0;
    xmlOutputCallbackTable[lVar1].closecallback = (xmlOutputCloseCallback)0x0;
  }
  return;
}

Assistant:

void
xmlRegisterDefaultOutputCallbacks (void) {
    xmlRegisterOutputCallbacks(xmlIODefaultMatch, NULL, NULL, NULL);
}